

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

int32_t advanceUntil(uint16_t *array,int32_t pos,int32_t length,uint16_t min)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  ushort uVar5;
  
  iVar3 = pos + 1;
  if ((length <= iVar3) || (min <= array[iVar3])) {
    return iVar3;
  }
  for (iVar2 = 1; iVar4 = iVar2 + iVar3, iVar4 < length; iVar2 = iVar2 * 2) {
    uVar5 = array[iVar4];
    if (min <= uVar5) goto LAB_001172c9;
  }
  iVar4 = length + -1;
  uVar5 = array[(long)length + -1];
LAB_001172c9:
  if (uVar5 != min) {
    if (uVar5 < min) {
      return length;
    }
    iVar1 = iVar4;
    iVar3 = (iVar2 >> 1) + iVar3;
    while (iVar4 = iVar1, iVar3 + 1 != iVar4) {
      iVar2 = iVar4 + iVar3 >> 1;
      if (array[iVar2] == min) {
        return iVar2;
      }
      iVar1 = iVar2;
      if (array[iVar2] < min) {
        iVar1 = iVar4;
        iVar3 = iVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

static inline int32_t advanceUntil(const uint16_t *array, int32_t pos,
                                   int32_t length, uint16_t min) {
    int32_t lower = pos + 1;

    if ((lower >= length) || (array[lower] >= min)) {
        return lower;
    }

    int32_t spansize = 1;

    while ((lower + spansize < length) && (array[lower + spansize] < min)) {
        spansize <<= 1;
    }
    int32_t upper = (lower + spansize < length) ? lower + spansize : length - 1;

    if (array[upper] == min) {
        return upper;
    }
    if (array[upper] < min) {
        // means
        // array
        // has no
        // item
        // >= min
        // pos = array.length;
        return length;
    }

    // we know that the next-smallest span was too small
    lower += (spansize >> 1);

    int32_t mid = 0;
    while (lower + 1 != upper) {
        mid = (lower + upper) >> 1;
        if (array[mid] == min) {
            return mid;
        } else if (array[mid] < min) {
            lower = mid;
        } else {
            upper = mid;
        }
    }
    return upper;
}